

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__tga_test(stbi__context *s)

{
  int iVar1;
  byte *pbVar2;
  stbi_uc *psVar3;
  uint uVar4;
  
  psVar3 = s->img_buffer;
  if (psVar3 < s->img_buffer_end) {
LAB_00111350:
    s->img_buffer = psVar3 + 1;
  }
  else if (s->read_from_callbacks != 0) {
    psVar3 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar3;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar3;
      s->img_buffer_end = psVar3 + iVar1;
    }
    psVar3 = s->img_buffer;
    goto LAB_00111350;
  }
  pbVar2 = s->img_buffer;
  if (pbVar2 < s->img_buffer_end) {
LAB_001113be:
    s->img_buffer = pbVar2 + 1;
    if (1 < *pbVar2) {
      return 0;
    }
  }
  else if (s->read_from_callbacks != 0) {
    psVar3 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar3;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar3;
      s->img_buffer_end = psVar3 + iVar1;
    }
    pbVar2 = s->img_buffer;
    goto LAB_001113be;
  }
  pbVar2 = s->img_buffer;
  if (s->img_buffer_end <= pbVar2) {
    if (s->read_from_callbacks == 0) {
      return 0;
    }
    psVar3 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar3;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar3;
      s->img_buffer_end = psVar3 + iVar1;
    }
    pbVar2 = s->img_buffer;
  }
  s->img_buffer = pbVar2 + 1;
  if ((byte)((*pbVar2 & 0xf7) - 4) < 0xfd) {
    return 0;
  }
  stbi__get16be(s);
  stbi__get16be(s);
  psVar3 = s->img_buffer;
  if (psVar3 < s->img_buffer_end) {
LAB_001114c8:
    s->img_buffer = psVar3 + 1;
  }
  else if (s->read_from_callbacks != 0) {
    psVar3 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar3;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar3;
      s->img_buffer_end = psVar3 + iVar1;
    }
    psVar3 = s->img_buffer;
    goto LAB_001114c8;
  }
  stbi__get16be(s);
  stbi__get16be(s);
  iVar1 = stbi__get16be(s);
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = stbi__get16be(s);
  if (iVar1 == 0) {
    return 0;
  }
  psVar3 = s->img_buffer;
  if (s->img_buffer_end <= psVar3) {
    if (s->read_from_callbacks == 0) {
      uVar4 = 0;
      goto LAB_00111581;
    }
    psVar3 = s->buffer_start;
    iVar1 = (*(s->io).read)(s->io_user_data,(char *)psVar3,s->buflen);
    if (iVar1 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar3;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar3;
      s->img_buffer_end = psVar3 + iVar1;
    }
    psVar3 = s->img_buffer;
  }
  s->img_buffer = psVar3 + 1;
  uVar4 = (uint)((*psVar3 - 8 & 0xe7) == 0);
LAB_00111581:
  s->img_buffer = s->img_buffer_original;
  return uVar4;
}

Assistant:

static int stbi__tga_test(stbi__context *s)
{
   int res;
   int sz;
   stbi__get8(s);      //   discard Offset
   sz = stbi__get8(s);   //   color type
   if ( sz > 1 ) return 0;   //   only RGB or indexed allowed
   sz = stbi__get8(s);   //   image type
   if ( (sz != 1) && (sz != 2) && (sz != 3) && (sz != 9) && (sz != 10) && (sz != 11) ) return 0;   //   only RGB or grey allowed, +/- RLE
   stbi__get16be(s);      //   discard palette start
   stbi__get16be(s);      //   discard palette length
   stbi__get8(s);         //   discard bits per palette color entry
   stbi__get16be(s);      //   discard x origin
   stbi__get16be(s);      //   discard y origin
   if ( stbi__get16be(s) < 1 ) return 0;      //   test width
   if ( stbi__get16be(s) < 1 ) return 0;      //   test height
   sz = stbi__get8(s);   //   bits per pixel
   if ( (sz != 8) && (sz != 16) && (sz != 24) && (sz != 32) )
      res = 0;
   else
      res = 1;
   stbi__rewind(s);
   return res;
}